

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btSoftBody::SContact>::resize
          (btAlignedObjectArray<btSoftBody::SContact> *this,int newsize,SContact *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  SContact *pSVar3;
  Node *pNVar4;
  Face *pFVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  iVar2 = this->m_size;
  lVar12 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar11 = lVar12 << 6;
    for (; lVar12 < newsize; lVar12 = lVar12 + 1) {
      pSVar3 = this->m_data;
      pNVar4 = fillData->m_node;
      pFVar5 = fillData->m_face;
      uVar6 = *(undefined8 *)(fillData->m_weights).m_floats;
      uVar7 = *(undefined8 *)((fillData->m_weights).m_floats + 2);
      uVar8 = *(undefined8 *)(fillData->m_normal).m_floats;
      uVar9 = *(undefined8 *)((fillData->m_normal).m_floats + 2);
      uVar10 = *(undefined8 *)fillData->m_cfm;
      puVar1 = (undefined8 *)((long)pSVar3->m_cfm + lVar11 + -8);
      *puVar1 = *(undefined8 *)&fillData->m_margin;
      puVar1[1] = uVar10;
      puVar1 = (undefined8 *)((long)(pSVar3->m_normal).m_floats + lVar11);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      puVar1 = (undefined8 *)((long)(pSVar3->m_weights).m_floats + lVar11);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)((long)&((SContact *)(&pSVar3->m_weights + -1))->m_node + lVar11);
      *puVar1 = pNVar4;
      puVar1[1] = pFVar5;
      lVar11 = lVar11 + 0x40;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}